

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.h
# Opt level: O2

void __thiscall
CMU462::DynamicScene::DirectionalLight::DirectionalLight
          (DirectionalLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  float fVar1;
  undefined4 local_88;
  uint uStack_84;
  undefined4 uStack_80;
  uint uStack_7c;
  double local_78;
  Vector4D local_68;
  Vector4D local_40;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_00281338;
  (this->spectrum).r = 0.0;
  (this->spectrum).g = 0.0;
  (this->spectrum).b = 0.0;
  (this->direction).z = 0.0;
  (this->direction).x = 0.0;
  (this->direction).y = 0.0;
  (this->spectrum).b = (light_info->spectrum).b;
  fVar1 = (light_info->spectrum).g;
  (this->spectrum).r = (light_info->spectrum).r;
  (this->spectrum).g = fVar1;
  local_68.x = (light_info->direction).x;
  local_68.y = (light_info->direction).y;
  local_68.z = (light_info->direction).z;
  local_68.w = 1.0;
  Matrix4x4::operator*(transform,&local_68);
  Vector4D::to3D(&local_40);
  *(undefined4 *)&(this->direction).x = local_88;
  *(uint *)((long)&(this->direction).x + 4) = uStack_84 ^ 0x80000000;
  *(undefined4 *)&(this->direction).y = uStack_80;
  *(uint *)((long)&(this->direction).y + 4) = uStack_7c ^ 0x80000000;
  (this->direction).z = -local_78;
  Vector3D::normalize(&this->direction);
  return;
}

Assistant:

DirectionalLight(const Collada::LightInfo& light_info,
                   const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->direction = -(transform * Vector4D(light_info.direction, 1)).to3D();
    this->direction.normalize();
  }